

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::(anonymous_namespace)::GetFileNameBase_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FileDescriptor *descriptor)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  csharp *pcVar5;
  char *pcVar6;
  csharp *pcVar7;
  bool in_R9B;
  bool bVar8;
  string_view input;
  
  lVar1 = **(long **)(this + 8);
  uVar2 = (*(long **)(this + 8))[1];
  uVar4 = uVar2;
  if (uVar2 == 0) {
    uVar4 = 0;
  }
  else {
    do {
      uVar3 = uVar4 - 1;
      if (uVar4 == 0) {
        uVar3 = 0xffffffffffffffff;
        break;
      }
      pcVar6 = (char *)(lVar1 + -1 + uVar4);
      uVar4 = uVar3;
    } while (*pcVar6 != '/');
    uVar4 = (ulong)((int)uVar3 + 1);
  }
  if (uVar2 < uVar4) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar4)
    ;
  }
  pcVar7 = (csharp *)(uVar2 - uVar4);
  if (pcVar7 == (csharp *)0x0) {
    pcVar5 = (csharp *)0xffffffffffffffff;
  }
  else {
    pcVar6 = (char *)(uVar2 + lVar1);
    pcVar5 = pcVar7;
    do {
      pcVar6 = pcVar6 + -1;
      bVar8 = pcVar5 == (csharp *)0x0;
      pcVar5 = pcVar5 + -1;
      if (bVar8) {
        pcVar5 = (csharp *)0xffffffffffffffff;
        break;
      }
    } while (*pcVar6 != '.');
    pcVar5 = (csharp *)(long)(int)pcVar5;
  }
  if (pcVar7 < pcVar5) {
    pcVar5 = pcVar7;
  }
  input._M_str = (char *)0x1;
  input._M_len = lVar1 + uVar4;
  UnderscoresToCamelCase_abi_cxx11_(__return_storage_ptr__,pcVar5,input,false,in_R9B);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileNameBase(const FileDescriptor* descriptor) {
  const absl::string_view proto_file = descriptor->name();
  int lastslash = proto_file.find_last_of('/');
  const absl::string_view base = proto_file.substr(lastslash + 1);
  return UnderscoresToPascalCase(StripDotProto(base));
}